

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O0

Dim * __thiscall
cnn::LogDet::dim_forward(LogDet *this,vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  initializer_list<unsigned_int> x;
  uint uVar1;
  uint uVar2;
  const_reference pvVar3;
  ostream *this_00;
  invalid_argument *this_01;
  vector<cnn::Dim,_std::allocator<cnn::Dim>_> *in_RDX;
  Dim *in_RDI;
  Dim *os;
  uint local_34;
  size_type in_stack_ffffffffffffffe0;
  
  os = in_RDI;
  pvVar3 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](in_RDX,0);
  uVar1 = Dim::ndims(pvVar3);
  if (uVar1 < 3) {
    pvVar3 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](in_RDX,0);
    uVar1 = Dim::rows(pvVar3);
    pvVar3 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](in_RDX,0);
    uVar2 = Dim::cols(pvVar3);
    if (uVar1 == uVar2) {
      local_34 = 1;
      x._M_len = in_stack_ffffffffffffffe0;
      x._M_array = (iterator)0x1;
      Dim::Dim((Dim *)&local_34,x);
      return os;
    }
  }
  std::operator<<((ostream *)&std::cerr,"Bad arguments in LogDet: ");
  this_00 = cnn::operator<<((ostream *)os,(vector<cnn::Dim,_std::allocator<cnn::Dim>_> *)in_RDI);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_01,"invalid arguments to LogDet");
  __cxa_throw(this_01,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Dim LogDet::dim_forward(const vector<Dim>& xs) const {
    if (xs[0].ndims() > 2 || (xs[0].rows() != xs[0].cols())) {
        cerr << "Bad arguments in LogDet: " << xs << endl;
        throw std::invalid_argument("invalid arguments to LogDet");
    }
    return Dim({1});
}